

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O2

string * __thiscall
Parameter<bool>::getParamType_abi_cxx11_(string *__return_storage_ptr__,Parameter<bool> *this)

{
  ParameterTraits<bool>::getParamType_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }